

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_serial.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  N_Vector X_00;
  N_Vector W_00;
  long lVar4;
  long lVar5;
  long lVar6;
  N_Vector x;
  long lVar7;
  N_Vector in_RSI;
  int in_EDI;
  undefined4 unaff_retaddr;
  int print_timing;
  N_Vector Z;
  N_Vector Y;
  N_Vector X;
  N_Vector W;
  N_Vector V;
  N_Vector U;
  sunindextype length;
  int retval;
  int fails;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  N_Vector in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  N_Vector in_stack_ffffffffffffffd0;
  N_Vector in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  iVar9 = 0;
  iVar8 = 0;
  Test_Init(0x1025b4);
  if (in_EDI < 3) {
    printf("ERROR: TWO (2) Inputs required: vector length, print timing \n");
    Test_Finalize();
    uVar10 = 0xffffffff;
  }
  else {
    X_00 = (N_Vector)atol((char *)in_RSI->ops);
    if ((long)X_00 < 1) {
      printf("ERROR: length of vector must be a positive integer \n");
      Test_Finalize();
      uVar10 = 0xffffffff;
    }
    else {
      iVar1 = atoi((char *)in_RSI->sunctx);
      SetTiming((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0);
      printf("Testing serial N_Vector \n");
      printf("Vector length %ld \n",X_00);
      W_00 = (N_Vector)N_VNewEmpty_Serial(X_00,sunctx);
      if (W_00 == (N_Vector)0x0) {
        printf("FAIL: Unable to create a new empty vector \n\n");
        Test_Finalize();
        uVar10 = 1;
      }
      else {
        lVar4 = N_VNew_Serial(X_00,sunctx);
        if (lVar4 == 0) {
          N_VDestroy(W_00);
          printf("FAIL: Unable to create a new vector \n\n");
          Test_Finalize();
          uVar10 = 1;
        }
        else {
          iVar1 = Test_N_VGetVectorID((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                      SUNDIALS_NVEC_SERIAL,0x1026ee);
          iVar1 = iVar1 + iVar8;
          iVar8 = Test_N_VGetLength(in_stack_ffffffffffffffb8,
                                    (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          iVar8 = iVar8 + iVar1;
          iVar1 = Test_N_VGetCommunicator
                            (in_stack_ffffffffffffffb8,
                             (SUNComm)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                             (int)in_stack_ffffffffffffffb0);
          iVar1 = iVar1 + iVar8;
          iVar8 = Test_N_VCloneEmpty(W_00,(int)((ulong)lVar4 >> 0x20));
          iVar8 = iVar8 + iVar1;
          iVar1 = Test_N_VClone(in_stack_ffffffffffffffd8,(sunindextype)in_stack_ffffffffffffffd0,
                                (int)((ulong)W_00 >> 0x20));
          iVar1 = iVar1 + iVar8;
          iVar8 = Test_N_VCloneEmptyVectorArray
                            ((int)in_stack_ffffffffffffffd0,W_00,(int)((ulong)lVar4 >> 0x20));
          iVar8 = iVar8 + iVar1;
          iVar1 = Test_N_VCloneVectorArray
                            ((int)X_00,in_stack_ffffffffffffffd8,
                             (sunindextype)in_stack_ffffffffffffffd0,(int)((ulong)W_00 >> 0x20));
          iVar1 = iVar1 + iVar8;
          iVar8 = Test_N_VSetArrayPointer
                            (in_stack_ffffffffffffffd8,(sunindextype)in_stack_ffffffffffffffd0,
                             (int)((ulong)W_00 >> 0x20));
          iVar8 = iVar8 + iVar1;
          iVar1 = Test_N_VGetArrayPointer
                            (in_stack_ffffffffffffffd8,(sunindextype)in_stack_ffffffffffffffd0,
                             (int)((ulong)W_00 >> 0x20));
          iVar1 = iVar1 + iVar8;
          lVar5 = N_VClone(lVar4);
          if (lVar5 == 0) {
            N_VDestroy(W_00);
            N_VDestroy(lVar4);
            printf("FAIL: Unable to create a new vector \n\n");
            Test_Finalize();
            uVar10 = 1;
          }
          else {
            lVar6 = N_VClone(lVar4);
            if (lVar6 == 0) {
              N_VDestroy(W_00);
              N_VDestroy(lVar4);
              N_VDestroy(lVar5);
              printf("FAIL: Unable to create a new vector \n\n");
              Test_Finalize();
              uVar10 = 1;
            }
            else {
              printf("\nTesting standard vector operations:\n\n");
              iVar8 = Test_N_VConst(in_stack_ffffffffffffffd0,(sunindextype)W_00,
                                    (int)((ulong)lVar4 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VLinearSum(X_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                        (sunindextype)W_00,(int)((ulong)lVar4 >> 0x20));
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VProd(X_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                   (sunindextype)W_00,(int)((ulong)lVar4 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VDiv(X_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                  (sunindextype)W_00,(int)((ulong)lVar4 >> 0x20));
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VScale(X_00,in_stack_ffffffffffffffd8,
                                    (sunindextype)in_stack_ffffffffffffffd0,
                                    (int)((ulong)W_00 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VAbs(X_00,in_stack_ffffffffffffffd8,
                                  (sunindextype)in_stack_ffffffffffffffd0,(int)((ulong)W_00 >> 0x20)
                                 );
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VInv(X_00,in_stack_ffffffffffffffd8,
                                  (sunindextype)in_stack_ffffffffffffffd0,(int)((ulong)W_00 >> 0x20)
                                 );
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VAddConst(X_00,in_stack_ffffffffffffffd8,
                                       (sunindextype)in_stack_ffffffffffffffd0,
                                       (int)((ulong)W_00 >> 0x20));
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VDotProd(in_RSI,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffe8),
                                      (sunindextype)X_00,
                                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VMaxNorm(X_00,(sunindextype)in_stack_ffffffffffffffd8,
                                      (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VWrmsNorm(in_RSI,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffe8),
                                       (sunindextype)X_00,
                                       (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VWrmsNormMask
                                ((N_Vector)CONCAT44(Y._4_4_,Y._0_4_),
                                 (N_Vector)CONCAT44(Z._4_4_,Z._0_4_),
                                 (N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                 CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VMin(X_00,(sunindextype)in_stack_ffffffffffffffd8,
                                  (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VWL2Norm((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                      (N_Vector)CONCAT44(iVar9,in_EDI),(sunindextype)in_RSI,iVar8);
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VL1Norm(in_RSI,CONCAT44(iVar1,in_stack_ffffffffffffffe8),
                                     (int)((ulong)X_00 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VCompare((N_Vector)CONCAT44(Z._4_4_,Z._0_4_),
                                      (N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                      CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VInvTest((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffe8),X_00,
                                      (sunindextype)in_stack_ffffffffffffffd8,
                                      (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
              iVar8 = iVar8 + iVar1;
              iVar1 = Test_N_VConstrMask(X,(N_Vector)CONCAT44(Y._4_4_,Y._0_4_),
                                         (N_Vector)CONCAT44(Z._4_4_,Z._0_4_),
                                         CONCAT44(print_timing,unaff_retaddr),iVar9);
              iVar1 = iVar1 + iVar8;
              iVar8 = Test_N_VMinQuotient(X_00,in_stack_ffffffffffffffd8,
                                          (sunindextype)in_stack_ffffffffffffffd0,
                                          (int)((ulong)W_00 >> 0x20));
              iVar3 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
              iVar8 = iVar8 + iVar1;
              printf("\nTesting fused and vector array operations (disabled):\n\n");
              x = (N_Vector)N_VNew_Serial(X_00,sunctx);
              iVar1 = N_VEnableFusedOps_Serial(x,0);
              if ((x == (N_Vector)0x0) || (iVar1 != 0)) {
                N_VDestroy(W_00);
                N_VDestroy(lVar4);
                N_VDestroy(lVar5);
                N_VDestroy(lVar6);
                printf("FAIL: Unable to create a new vector \n\n");
                Test_Finalize();
                uVar10 = 1;
              }
              else {
                iVar2 = Test_N_VLinearCombination
                                  ((N_Vector)CONCAT44(W._4_4_,W._0_4_),(sunindextype)X,Y._4_4_);
                iVar2 = iVar2 + iVar8;
                iVar8 = Test_N_VScaleAddMulti
                                  ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                   CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                iVar8 = iVar8 + iVar2;
                iVar2 = Test_N_VDotProdMulti
                                  ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                   CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                iVar2 = iVar2 + iVar8;
                iVar8 = Test_N_VLinearSumVectorArray
                                  (in_RSI,CONCAT44(iVar2,iVar1),(int)((ulong)X_00 >> 0x20));
                iVar8 = iVar8 + iVar2;
                iVar1 = Test_N_VScaleVectorArray
                                  ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                   CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                iVar1 = iVar1 + iVar8;
                iVar8 = Test_N_VConstVectorArray(X_00,(sunindextype)x,iVar3);
                iVar8 = iVar8 + iVar1;
                iVar1 = Test_N_VWrmsNormVectorArray
                                  ((N_Vector)CONCAT44(Y._4_4_,Y._0_4_),CONCAT44(Z._4_4_,Z._0_4_),
                                   print_timing);
                iVar1 = iVar1 + iVar8;
                iVar8 = Test_N_VWrmsNormMaskVectorArray(U,(sunindextype)V,W._4_4_);
                iVar8 = iVar8 + iVar1;
                iVar1 = Test_N_VScaleAddMultiVectorArray(U,(sunindextype)V,W._4_4_);
                iVar1 = iVar1 + iVar8;
                iVar8 = Test_N_VLinearCombinationVectorArray
                                  ((N_Vector)CONCAT44(Y._4_4_,Y._0_4_),CONCAT44(Z._4_4_,Z._0_4_),
                                   print_timing);
                iVar8 = iVar8 + iVar1;
                printf("\nTesting fused and vector array operations (enabled):\n\n");
                lVar7 = N_VNew_Serial(X_00,sunctx);
                iVar1 = N_VEnableFusedOps_Serial(lVar7,1);
                if ((lVar7 == 0) || (iVar1 != 0)) {
                  N_VDestroy(W_00);
                  N_VDestroy(lVar4);
                  N_VDestroy(lVar5);
                  N_VDestroy(lVar6);
                  N_VDestroy(x);
                  printf("FAIL: Unable to create a new vector \n\n");
                  Test_Finalize();
                  uVar10 = 1;
                }
                else {
                  iVar3 = Test_N_VLinearCombination
                                    ((N_Vector)CONCAT44(W._4_4_,W._0_4_),(sunindextype)X,Y._4_4_);
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VScaleAddMulti
                                    ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                     CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VDotProdMulti
                                    ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                     CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VLinearSumVectorArray
                                    (in_RSI,CONCAT44(iVar3,iVar1),(int)((ulong)X_00 >> 0x20));
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VScaleVectorArray
                                    ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                     CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VConstVectorArray(X_00,(sunindextype)x,(int)((ulong)lVar7 >> 0x20))
                  ;
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VWrmsNormVectorArray
                                    ((N_Vector)CONCAT44(Y._4_4_,Y._0_4_),CONCAT44(Z._4_4_,Z._0_4_),
                                     print_timing);
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VWrmsNormMaskVectorArray(U,(sunindextype)V,W._4_4_);
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VScaleAddMultiVectorArray(U,(sunindextype)V,W._4_4_);
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VLinearCombinationVectorArray
                                    ((N_Vector)CONCAT44(Y._4_4_,Y._0_4_),CONCAT44(Z._4_4_,Z._0_4_),
                                     print_timing);
                  iVar8 = iVar8 + iVar3;
                  printf("\nTesting local reduction operations:\n\n");
                  iVar3 = Test_N_VDotProdLocal
                                    ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                     (N_Vector)CONCAT44(iVar9,in_EDI),(sunindextype)in_RSI,iVar8);
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VMaxNormLocal
                                    ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                     CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VMinLocal(in_RSI,CONCAT44(iVar8,iVar1),(int)((ulong)X_00 >> 0x20));
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VL1NormLocal((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                              CONCAT44(iVar9,in_EDI),(int)((ulong)in_RSI >> 0x20));
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VWSqrSumLocal
                                    ((N_Vector)CONCAT44(W._4_4_,W._0_4_),X,CONCAT44(Y._4_4_,Y._0_4_)
                                     ,Z._4_4_);
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VWSqrSumMaskLocal
                                    ((N_Vector)CONCAT44(W._4_4_,W._0_4_),X,
                                     (N_Vector)CONCAT44(Y._4_4_,Y._0_4_),CONCAT44(Z._4_4_,Z._0_4_),
                                     print_timing);
                  iVar8 = iVar8 + iVar3;
                  iVar3 = Test_N_VInvTestLocal
                                    ((N_Vector)CONCAT44(iVar9,in_EDI),in_RSI,CONCAT44(iVar8,iVar1),
                                     (int)((ulong)X_00 >> 0x20));
                  iVar3 = iVar3 + iVar8;
                  iVar8 = Test_N_VConstrMaskLocal
                                    (X,(N_Vector)CONCAT44(Y._4_4_,Y._0_4_),
                                     (N_Vector)CONCAT44(Z._4_4_,Z._0_4_),
                                     CONCAT44(print_timing,unaff_retaddr),iVar9);
                  iVar8 = iVar8 + iVar3;
                  iVar9 = Test_N_VMinQuotientLocal
                                    ((N_Vector)CONCAT44(print_timing,unaff_retaddr),
                                     (N_Vector)CONCAT44(iVar9,in_EDI),(sunindextype)in_RSI,iVar8);
                  iVar9 = iVar9 + iVar8;
                  printf("\nTesting local fused reduction operations:\n\n");
                  iVar8 = Test_N_VDotProdMultiLocal
                                    (in_RSI,CONCAT44(iVar9,iVar1),(int)((ulong)X_00 >> 0x20));
                  iVar8 = iVar8 + iVar9;
                  printf("\nTesting XBraid interface operations:\n\n");
                  iVar9 = Test_N_VBufSize(x,lVar7,(int)((ulong)W_00 >> 0x20));
                  iVar9 = iVar9 + iVar8;
                  iVar8 = Test_N_VBufPack((N_Vector)CONCAT44(iVar9,iVar1),(sunindextype)X_00,
                                          (int)((ulong)x >> 0x20));
                  iVar8 = iVar8 + iVar9;
                  iVar9 = Test_N_VBufUnpack((N_Vector)CONCAT44(iVar8,iVar1),(sunindextype)X_00,
                                            (int)((ulong)x >> 0x20));
                  uVar10 = iVar9 + iVar8;
                  N_VDestroy(W_00);
                  N_VDestroy(lVar4);
                  N_VDestroy(lVar5);
                  N_VDestroy(lVar6);
                  N_VDestroy(x);
                  N_VDestroy(lVar7);
                  if (uVar10 == 0) {
                    printf("SUCCESS: NVector module passed all tests \n\n");
                  }
                  else {
                    printf("FAIL: NVector module failed %i tests \n\n",(ulong)uVar10);
                  }
                  Test_Finalize();
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar10;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;             /* counter for test failures */
  int retval;                /* function return value     */
  sunindextype length;       /* vector length             */
  N_Vector U, V, W, X, Y, Z; /* test vectors              */
  int print_timing;          /* turn timing on/off        */

  Test_Init(SUN_COMM_NULL);

  /* check input and set vector length */
  if (argc < 3)
  {
    printf("ERROR: TWO (2) Inputs required: vector length, print timing \n");
    Test_Finalize();
    return (-1);
  }

  length = (sunindextype)atol(argv[1]);
  if (length <= 0)
  {
    printf("ERROR: length of vector must be a positive integer \n");
    Test_Finalize();
    return (-1);
  }

  print_timing = atoi(argv[2]);
  SetTiming(print_timing, 0);

  printf("Testing serial N_Vector \n");
  printf("Vector length %ld \n", (long int)length);

  /* Create new vectors */
  W = N_VNewEmpty_Serial(length, sunctx);
  if (W == NULL)
  {
    printf("FAIL: Unable to create a new empty vector \n\n");
    Test_Finalize();
    return (1);
  }

  X = N_VNew_Serial(length, sunctx);
  if (X == NULL)
  {
    N_VDestroy(W);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Finalize();
    return (1);
  }

  /* Check vector ID */
  fails += Test_N_VGetVectorID(X, SUNDIALS_NVEC_SERIAL, 0);

  /* Check vector length */
  fails += Test_N_VGetLength(X, 0);

  /* Check vector communicator */
  fails += Test_N_VGetCommunicator(X, SUN_COMM_NULL, 0);

  /* Test clone functions */
  fails += Test_N_VCloneEmpty(X, 0);
  fails += Test_N_VClone(X, length, 0);
  fails += Test_N_VCloneEmptyVectorArray(5, X, 0);
  fails += Test_N_VCloneVectorArray(5, X, length, 0);

  /* Test setting/getting array data */
  fails += Test_N_VSetArrayPointer(W, length, 0);
  fails += Test_N_VGetArrayPointer(X, length, 0);

  /* Clone additional vectors for testing */
  Y = N_VClone(X);
  if (Y == NULL)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Finalize();
    return (1);
  }

  Z = N_VClone(X);
  if (Z == NULL)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Finalize();
    return (1);
  }

  /* Standard vector operation tests */
  printf("\nTesting standard vector operations:\n\n");

  fails += Test_N_VConst(X, length, 0);
  fails += Test_N_VLinearSum(X, Y, Z, length, 0);
  fails += Test_N_VProd(X, Y, Z, length, 0);
  fails += Test_N_VDiv(X, Y, Z, length, 0);
  fails += Test_N_VScale(X, Z, length, 0);
  fails += Test_N_VAbs(X, Z, length, 0);
  fails += Test_N_VInv(X, Z, length, 0);
  fails += Test_N_VAddConst(X, Z, length, 0);
  fails += Test_N_VDotProd(X, Y, length, 0);
  fails += Test_N_VMaxNorm(X, length, 0);
  fails += Test_N_VWrmsNorm(X, Y, length, 0);
  fails += Test_N_VWrmsNormMask(X, Y, Z, length, 0);
  fails += Test_N_VMin(X, length, 0);
  fails += Test_N_VWL2Norm(X, Y, length, 0);
  fails += Test_N_VL1Norm(X, length, 0);
  fails += Test_N_VCompare(X, Z, length, 0);
  fails += Test_N_VInvTest(X, Z, length, 0);
  fails += Test_N_VConstrMask(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotient(X, Y, length, 0);

  /* Fused and vector array operations tests (disabled) */
  printf("\nTesting fused and vector array operations (disabled):\n\n");

  /* create vector and disable all fused and vector array operations */
  U      = N_VNew_Serial(length, sunctx);
  retval = N_VEnableFusedOps_Serial(U, SUNFALSE);
  if (U == NULL || retval != 0)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Finalize();
    return (1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(U, length, 0);
  fails += Test_N_VScaleAddMulti(U, length, 0);
  fails += Test_N_VDotProdMulti(U, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(U, length, 0);
  fails += Test_N_VScaleVectorArray(U, length, 0);
  fails += Test_N_VConstVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormVectorArray(U, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(U, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(U, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(U, length, 0);

  /* Fused and vector array operations tests (enabled) */
  printf("\nTesting fused and vector array operations (enabled):\n\n");

  /* create vector and enable all fused and vector array operations */
  V      = N_VNew_Serial(length, sunctx);
  retval = N_VEnableFusedOps_Serial(V, SUNTRUE);
  if (V == NULL || retval != 0)
  {
    N_VDestroy(W);
    N_VDestroy(X);
    N_VDestroy(Y);
    N_VDestroy(Z);
    N_VDestroy(U);
    printf("FAIL: Unable to create a new vector \n\n");
    Test_Finalize();
    return (1);
  }

  /* fused operations */
  fails += Test_N_VLinearCombination(V, length, 0);
  fails += Test_N_VScaleAddMulti(V, length, 0);
  fails += Test_N_VDotProdMulti(V, length, 0);

  /* vector array operations */
  fails += Test_N_VLinearSumVectorArray(V, length, 0);
  fails += Test_N_VScaleVectorArray(V, length, 0);
  fails += Test_N_VConstVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormVectorArray(V, length, 0);
  fails += Test_N_VWrmsNormMaskVectorArray(V, length, 0);
  fails += Test_N_VScaleAddMultiVectorArray(V, length, 0);
  fails += Test_N_VLinearCombinationVectorArray(V, length, 0);

  /* local reduction operations */
  printf("\nTesting local reduction operations:\n\n");

  fails += Test_N_VDotProdLocal(X, Y, length, 0);
  fails += Test_N_VMaxNormLocal(X, length, 0);
  fails += Test_N_VMinLocal(X, length, 0);
  fails += Test_N_VL1NormLocal(X, length, 0);
  fails += Test_N_VWSqrSumLocal(X, Y, length, 0);
  fails += Test_N_VWSqrSumMaskLocal(X, Y, Z, length, 0);
  fails += Test_N_VInvTestLocal(X, Z, length, 0);
  fails += Test_N_VConstrMaskLocal(X, Y, Z, length, 0);
  fails += Test_N_VMinQuotientLocal(X, Y, length, 0);

  /* local fused reduction operations */
  printf("\nTesting local fused reduction operations:\n\n");
  fails += Test_N_VDotProdMultiLocal(V, length, 0);

  /* XBraid interface operations */
  printf("\nTesting XBraid interface operations:\n\n");

  fails += Test_N_VBufSize(X, length, 0);
  fails += Test_N_VBufPack(X, length, 0);
  fails += Test_N_VBufUnpack(X, length, 0);

  /* Free vectors */
  N_VDestroy(W);
  N_VDestroy(X);
  N_VDestroy(Y);
  N_VDestroy(Z);
  N_VDestroy(U);
  N_VDestroy(V);

  /* Print result */
  if (fails) { printf("FAIL: NVector module failed %i tests \n\n", fails); }
  else { printf("SUCCESS: NVector module passed all tests \n\n"); }

  Test_Finalize();
  return (fails);
}